

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O1

void setPrefixPresent(InternalInstruction *insn,uint8_t prefix,uint64_t location)

{
  long lVar1;
  int iVar2;
  undefined7 in_register_00000031;
  
  iVar2 = (int)CONCAT71(in_register_00000031,prefix);
  if (iVar2 < 100) {
    if (iVar2 < 0x36) {
      if (iVar2 == 0x26) {
        insn->isPrefix26 = true;
        lVar1 = 0x10;
      }
      else {
        if (iVar2 != 0x2e) {
          return;
        }
        insn->isPrefix2e = true;
        lVar1 = 0x18;
      }
    }
    else if (iVar2 == 0x36) {
      insn->isPrefix36 = true;
      lVar1 = 0x20;
    }
    else {
      if (iVar2 != 0x3e) {
        return;
      }
      insn->isPrefix3e = true;
      lVar1 = 0x28;
    }
  }
  else if (iVar2 < 0xf0) {
    switch(iVar2) {
    case 100:
      insn->isPrefix64 = true;
      lVar1 = 0x30;
      break;
    case 0x65:
      insn->isPrefix65 = true;
      lVar1 = 0x38;
      break;
    case 0x66:
      insn->isPrefix66 = true;
      lVar1 = 0x40;
      break;
    case 0x67:
      insn->isPrefix67 = true;
      lVar1 = 0x48;
      break;
    default:
      goto switchD_001a64df_default;
    }
  }
  else if (iVar2 == 0xf0) {
    insn->isPrefixf0 = true;
    lVar1 = 0x50;
  }
  else if (iVar2 == 0xf2) {
    insn->isPrefixf2 = true;
    lVar1 = 0x58;
  }
  else {
    if (iVar2 != 0xf3) {
      return;
    }
    insn->isPrefixf3 = true;
    lVar1 = 0x60;
  }
  *(uint64_t *)(&insn->operandSize + lVar1) = location;
switchD_001a64df_default:
  return;
}

Assistant:

static void setPrefixPresent(struct InternalInstruction *insn,
		uint8_t prefix, uint64_t location)
{
	switch (prefix)
	{
	case 0x26:
		insn->isPrefix26 = true;
		insn->prefix26 = location;
		break;
	case 0x2e:
		insn->isPrefix2e = true;
		insn->prefix2e = location;
		break;
	case 0x36:
		insn->isPrefix36 = true;
		insn->prefix36 = location;
		break;
	case 0x3e:
		insn->isPrefix3e = true;
		insn->prefix3e = location;
		break;
	case 0x64:
		insn->isPrefix64 = true;
		insn->prefix64 = location;
		break;
	case 0x65:
		insn->isPrefix65 = true;
		insn->prefix65 = location;
		break;
	case 0x66:
		insn->isPrefix66 = true;
		insn->prefix66 = location;
		break;
	case 0x67:
		insn->isPrefix67 = true;
		insn->prefix67 = location;
		break;
	case 0xf0:
		insn->isPrefixf0 = true;
		insn->prefixf0 = location;
		break;
	case 0xf2:
		insn->isPrefixf2 = true;
		insn->prefixf2 = location;
		break;
	case 0xf3:
		insn->isPrefixf3 = true;
		insn->prefixf3 = location;
		break;
	default:
		break;
	}
}